

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

exr_result_t validate_deep_data(exr_context_t f,exr_priv_part_t curpart)

{
  exr_attr_chlist_t *peVar1;
  exr_attr_chlist_entry_t *peVar2;
  bool bVar3;
  exr_result_t eVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  
  if ((curpart->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) {
    if (curpart->comp_type < EXR_COMPRESSION_ZIP) {
      peVar1 = (curpart->channels->field_6).chlist;
      lVar5 = (long)peVar1->num_channels;
      bVar3 = true;
      if (0 < lVar5) {
        peVar2 = peVar1->entries;
        lVar5 = lVar5 * 0x20;
        lVar7 = 0;
        do {
          if (*(int *)(peVar2->reserved + lVar7 + 3) != 1) {
            uVar6 = *(undefined8 *)(peVar2->reserved + lVar7 + -0xd);
            pcVar8 = "channel \'%s\': x subsampling factor is not 1 (%d) for a deep image";
LAB_00134ef4:
            bVar3 = false;
            eVar4 = (*f->print_error)(f,0xe,pcVar8,uVar6);
            goto LAB_00134f00;
          }
          if (*(int *)(peVar2->reserved + lVar7 + 7) != 1) {
            uVar6 = *(undefined8 *)(peVar2->reserved + lVar7 + -0xd);
            pcVar8 = "channel \'%s\': y subsampling factor is not 1 (%d) for a deep image";
            goto LAB_00134ef4;
          }
          lVar7 = lVar7 + 0x20;
        } while (lVar5 != lVar7);
      }
      eVar4 = (exr_result_t)lVar5;
    }
    else {
      eVar4 = (*f->report_error)(f,0xe,"Invalid compression for deep data");
      bVar3 = false;
    }
LAB_00134f00:
    if (!bVar3) {
      return eVar4;
    }
  }
  return 0;
}

Assistant:

static exr_result_t
validate_deep_data (exr_context_t f, exr_priv_part_t curpart)
{
    if (curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        const exr_attr_chlist_t* channels = curpart->channels->chlist;

        // none, rle, zips
        if (curpart->comp_type != EXR_COMPRESSION_NONE &&
            curpart->comp_type != EXR_COMPRESSION_RLE &&
            curpart->comp_type != EXR_COMPRESSION_ZIPS)
            return f->report_error (
                f, EXR_ERR_INVALID_ATTR, "Invalid compression for deep data");

        for (int c = 0; c < channels->num_channels; ++c)
        {
            if (channels->entries[c].x_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': x subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].x_sampling);
            if (channels->entries[c].y_sampling != 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "channel '%s': y subsampling factor is not 1 (%d) for a deep image",
                    channels->entries[c].name.str,
                    channels->entries[c].y_sampling);
        }
    }

    return EXR_ERR_SUCCESS;
}